

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

void Gia_ManPrintFanio(Gia_Man_t *pGia,int nNodes)

{
  int iVar1;
  abctime aVar2;
  Cof_Man_t *p;
  int *piVar3;
  abctime aVar4;
  
  aVar2 = Abc_Clock();
  p = Cof_ManCreateLogicSimple(pGia);
  iVar1 = Gia_ManLevelNum(pGia);
  p->nLevels = iVar1 + 1;
  piVar3 = (int *)calloc((long)(iVar1 + 1),4);
  p->pLevels = piVar3;
  Cof_ManPrintFanio(p);
  if (0 < nNodes) {
    Cof_ManCleanValue(p);
    p->nTravIds = 1;
    Gia_ManHashStart(pGia);
    Cof_ManPrintHighFanout(p,nNodes);
    Gia_ManHashStop(pGia);
    iVar1 = (int)pGia;
    Abc_Print(iVar1,"%s =","Memory for logic network");
    Abc_Print(iVar1,"%10.3f MB  ",(double)(p->nObjData << 2) * 9.5367431640625e-07);
    Abc_Print(iVar1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
  }
  Cof_ManStop(p);
  return;
}

Assistant:

void Gia_ManPrintFanio( Gia_Man_t * pGia, int nNodes )
{
    Cof_Man_t * p;
    abctime clk = Abc_Clock();
    p = Cof_ManCreateLogicSimple( pGia );
    p->nLevels = 1 + Gia_ManLevelNum( pGia );
    p->pLevels = ABC_CALLOC( int, p->nLevels );
    Cof_ManPrintFanio( p );

    if ( nNodes > 0 )
    {
    Cof_ManResetTravId( p );
    Gia_ManHashStart( pGia );
    Cof_ManPrintHighFanout( p, nNodes );
    Gia_ManHashStop( pGia );
ABC_PRMn( "Memory for logic network", 4*p->nObjData );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    Cof_ManStop( p );
}